

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O1

SQInteger thread_getstackinfos(HSQUIRRELVM v)

{
  SQUnsignedInteger *pSVar1;
  SQObjectValue v_00;
  SQObjectPtr *pSVar2;
  SQInteger newtop;
  SQInteger SVar3;
  SQRESULT SVar4;
  SQObjectPtr o;
  SQInteger level;
  SQObjectPtr local_30;
  SQInteger local_20;
  
  pSVar2 = SQVM::GetAt(v,v->_stackbase);
  local_30.super_SQObject._type = (pSVar2->super_SQObject)._type;
  v_00 = (SQObjectValue)(pSVar2->super_SQObject)._unVal.pTable;
  if ((local_30.super_SQObject._type >> 0x1b & 1) != 0) {
    pSVar1 = &((v_00.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  local_30.super_SQObject._unVal = v_00;
  if (local_30.super_SQObject._type == OT_THREAD) {
    newtop = sq_gettop((HSQUIRRELVM)v_00.pTable);
    sq_getinteger(v,-1,&local_20);
    SVar3 = __getcallstackinfos((HSQUIRRELVM)v_00.pTable,local_20);
    if (SVar3 == 0) {
      sq_settop((HSQUIRRELVM)v_00.pTable,newtop);
      SVar4 = 0;
    }
    else {
      sq_move(v,(HSQUIRRELVM)v_00.pTable,-1);
      SVar4 = 1;
      sq_settop((HSQUIRRELVM)v_00.pTable,newtop);
    }
  }
  else {
    SVar4 = sq_throwerror(v,"wrong parameter");
  }
  SQObjectPtr::~SQObjectPtr(&local_30);
  return SVar4;
}

Assistant:

static SQInteger thread_getstackinfos(HSQUIRRELVM v)
{
    SQObjectPtr o = stack_get(v,1);
    if(type(o) == OT_THREAD) {
        SQVM *thread = _thread(o);
        SQInteger threadtop = sq_gettop(thread);
        SQInteger level;
        sq_getinteger(v,-1,&level);
        SQRESULT res = __getcallstackinfos(thread,level);
        if(SQ_FAILED(res))
        {
            sq_settop(thread,threadtop);
            if(type(thread->_lasterror) == OT_STRING) {
                sq_throwerror(v,_stringval(thread->_lasterror));
            }
            else {
                sq_throwerror(v,_SC("unknown error"));
            }
        }
        if(res > 0) {
            //some result
            sq_move(v,thread,-1);
            sq_settop(thread,threadtop);
            return 1;
        }
        //no result
        sq_settop(thread,threadtop);
        return 0;

    }
    return sq_throwerror(v,_SC("wrong parameter"));
}